

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O1

vanilla_chronicle_settings * __thiscall
cornelich::vanilla_chronicle_settings::cycle_length
          (vanilla_chronicle_settings *this,int32_t cycle_length,
          shared_ptr<cornelich::cycle_formatter> *formatter,bool check)

{
  invalid_argument *this_00;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (3599999 < cycle_length || !check) {
    this->m_cycle_length = cycle_length;
    (this->m_cycle_format).
    super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (formatter->super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_cycle_format).
                super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(formatter->
                super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    return this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Cycle length [ms] can\'t be less than ",0x25);
  std::ostream::_M_insert<long>((long)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(local_190," ms",3);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

vanilla_chronicle_settings & vanilla_chronicle_settings::cycle_length(const std::int32_t cycle_length, const std::shared_ptr<cycle_formatter> & formatter, bool check)
{
    if(check && cycle_length < min_cycle_length())
        throw std::invalid_argument(util::streamer() << "Cycle length [ms] can't be less than " << min_cycle_length() << " ms");
    m_cycle_length = cycle_length;
    m_cycle_format = formatter;
    return *this;
}